

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O2

Sexp * __thiscall GcHeap::GcHeapImpl::Copy(GcHeapImpl *this,Sexp *from_ref)

{
  mapped_type pSVar1;
  Sexp *pSVar2;
  uint64_t uVar3;
  Kind KVar4;
  undefined4 uVar5;
  mapped_type *ppSVar6;
  Sexp *local_30;
  Sexp *from_ref_local;
  Sexp *to_ref;
  
  pSVar1 = (mapped_type)this->free;
  this->free = (uint8_t *)(pSVar1 + 1);
  local_30 = from_ref;
  from_ref_local = pSVar1;
  DebugLog("[%d] relocating: %p -> %p",this->gc_number,from_ref,pSVar1);
  if (from_ref->padding != 0xabababababababab) {
    KVar4 = from_ref->kind;
    uVar5 = *(undefined4 *)&from_ref->field_0x4;
    pSVar2 = (from_ref->field_1).cons.car;
    uVar3 = from_ref->padding;
    (pSVar1->field_1).cons.cdr = (from_ref->field_1).cons.cdr;
    pSVar1->padding = uVar3;
    pSVar1->kind = KVar4;
    *(undefined4 *)&pSVar1->field_0x4 = uVar5;
    (pSVar1->field_1).cons.car = pSVar2;
    *(undefined8 *)from_ref = 0xabababababababab;
    (from_ref->field_1).cons.car = (Sexp *)0xabababababababab;
    (from_ref->field_1).cons.cdr = (Sexp *)0xabababababababab;
    from_ref->padding = 0xabababababababab;
    ppSVar6 = std::__detail::
              _Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->forwarding_addresses,&local_30);
    *ppSVar6 = pSVar1;
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::push_back(&this->worklist,&from_ref_local);
    return from_ref_local;
  }
  __assert_fail("from_ref->padding != 0xabababababababab && \"relocating an invalid object\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x156,"Sexp *GcHeap::GcHeapImpl::Copy(Sexp *)");
}

Assistant:

Sexp *Copy(Sexp *from_ref) {
    Sexp *to_ref = (Sexp *)free;
    free += sizeof(Sexp);
    // this copy is guaranteed not to overlap since it
    // doesn't cross the fromspace/tospace boundary.
    DebugLog("[%d] relocating: %p -> %p", gc_number, from_ref, to_ref);
#ifdef DEBUG
    assert(from_ref->padding != 0xabababababababab &&
           "relocating an invalid object");
#endif
    memcpy(to_ref, from_ref, sizeof(Sexp));

#ifdef DEBUG
    // use a distinct bit pattern to ensure that
    // we insta-crash on a GC hole.
    memset(from_ref, 0xAB, sizeof(Sexp));
#endif

    forwarding_addresses[from_ref] = to_ref;
    worklist.push_back(to_ref);
    return to_ref;
  }